

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_schedule_vbell(Terminal *term,_Bool already_started,long startpoint)

{
  unsigned_long uVar1;
  long lVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,already_started) == 0) {
    lVar2 = 0;
  }
  else {
    uVar1 = getticks();
    lVar2 = uVar1 - startpoint;
    if (99 < lVar2) {
      term->in_vbell = false;
      return;
    }
  }
  term->in_vbell = true;
  uVar1 = schedule_timer(100 - (int)lVar2,term_timer,term);
  term->vbell_end = uVar1;
  return;
}

Assistant:

static void term_schedule_vbell(Terminal *term, bool already_started,
                                long startpoint)
{
    long ticks_already_gone;

    if (already_started)
        ticks_already_gone = GETTICKCOUNT() - startpoint;
    else
        ticks_already_gone = 0;

    if (ticks_already_gone < VBELL_DELAY) {
        term->in_vbell = true;
        term->vbell_end = schedule_timer(VBELL_DELAY - ticks_already_gone,
                                         term_timer, term);
    } else {
        term->in_vbell = false;
    }
}